

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

bc_string_t * bc_string_append_c(bc_string_t *str,char c)

{
  size_t sVar1;
  char *pcVar2;
  size_t size;
  
  if (str == (bc_string_t *)0x0) {
    str = (bc_string_t *)0x0;
  }
  else {
    sVar1 = str->len;
    str->len = sVar1 + 1;
    if (str->allocated_len < sVar1 + 2) {
      size = (sVar1 + 2 & 0xffffffffffffff80) + 0x80;
      str->allocated_len = size;
      pcVar2 = (char *)bc_realloc(str->str,size);
      str->str = pcVar2;
    }
    str->str[sVar1] = c;
    str->str[str->len] = '\0';
  }
  return str;
}

Assistant:

bc_string_t*
bc_string_append_c(bc_string_t *str, char c)
{
    if (str == NULL)
        return NULL;
    size_t old_len = str->len;
    str->len += 1;
    if (str->len + 1 > str->allocated_len) {
        str->allocated_len = (((str->len + 1) / BC_STRING_CHUNK_SIZE) + 1) * BC_STRING_CHUNK_SIZE;
        str->str = bc_realloc(str->str, str->allocated_len);
    }
    str->str[old_len] = c;
    str->str[str->len] = '\0';
    return str;
}